

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_string(lua_State *L)

{
  char *pcVar1;
  CTState *pCVar2;
  int32_t iVar3;
  size_t local_e8;
  size_t len;
  char *p;
  TValue *o;
  CTState *cts;
  lua_State *L_local;
  char *local_b8;
  CTState *local_b0;
  undefined4 local_a4;
  lua_State *local_a0;
  char *local_98;
  CTState *local_90;
  undefined4 local_84;
  lua_State *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  CTState *local_60;
  TValue *local_58;
  CTState *cts_1;
  undefined4 local_44;
  TValue *local_40;
  undefined4 local_34;
  TValue *local_30;
  undefined4 local_24;
  TValue *local_20;
  undefined4 local_14;
  TValue *local_10;
  
  o = *(TValue **)((L->glref).ptr64 + 0x180);
  o[2] = (TValue)L;
  cts = (CTState *)L;
  local_58 = o;
  cts_1 = (CTState *)L;
  p = (char *)lj_lib_checkany(L,1);
  if (((TValue *)((long)p + 8) < (TValue *)cts->miscmap) &&
     (((TValue *)((long)p + 8))->u64 != 0xffffffffffffffff)) {
    iVar3 = ffi_checkint((lua_State *)cts,2);
    local_e8 = (size_t)iVar3;
    local_30 = o;
    local_34 = 0x12;
    local_20 = o;
    local_24 = 0x12;
    lj_cconv_ct_tv((CTState *)&o->gcr,(CType *)(o->u64 + 0x1b0),(uint8_t *)&len,(TValue *)p,0x100);
  }
  else {
    local_40 = o;
    local_44 = 0x13;
    local_10 = o;
    local_14 = 0x13;
    lj_cconv_ct_tv((CTState *)&o->gcr,(CType *)(o->u64 + 0x1c8),(uint8_t *)&len,(TValue *)p,0x100);
    local_e8 = strlen((char *)len);
  }
  pCVar2 = cts;
  pcVar1 = p;
  cts->miscmap = (GCtab *)(p + 8);
  L_local = (lua_State *)lj_str_new((lua_State *)cts,(char *)len,local_e8);
  local_b0 = pCVar2;
  local_b8 = pcVar1;
  local_90 = pCVar2;
  local_98 = pcVar1;
  local_a4 = 0xfffffffb;
  local_78 = pcVar1;
  local_84 = 0xfffffffb;
  *(ulong *)pcVar1 = (ulong)L_local | 0xfffd800000000000;
  local_60 = pCVar2;
  local_68 = pcVar1;
  local_70 = "store to dead GC object";
  if ((cts->L->gclist).gcptr64 <= (cts->L->glref).ptr64) {
    local_a0 = L_local;
    local_80 = L_local;
    lj_gc_step((lua_State *)cts);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_string)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  TValue *o = lj_lib_checkany(L, 1);
  const char *p;
  size_t len;
  if (o+1 < L->top && !tvisnil(o+1)) {
    len = (size_t)ffi_checkint(L, 2);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p, o,
		   CCF_ARG(1));
  } else {
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CCHAR), (uint8_t *)&p, o,
		   CCF_ARG(1));
    len = strlen(p);
  }
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  setstrV(L, o, lj_str_new(L, p, len));
  lj_gc_check(L);
  return 1;
}